

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_ecdsa_adaptor_encrypt
              (secp256k1_context *ctx,uchar *adaptor_sig162,uchar *seckey32,
              secp256k1_pubkey_conflict *enckey,uchar *msg32,
              secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp,void *ndata)

{
  uchar *s;
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_EAX;
  int iVar4;
  undefined4 extraout_EAX_00;
  uint uVar5;
  undefined4 extraout_EAX_01;
  undefined4 extraout_EAX_02;
  int iVar6;
  void *pvVar7;
  char *pcVar8;
  code *pcVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  size_t local_5a0;
  secp256k1_nonce_function_hardened_ecdsa_adaptor local_598;
  uchar *local_590;
  uchar *local_588;
  uchar *local_580;
  secp256k1_scalar dleq_proof_e;
  secp256k1_scalar dleq_proof_s;
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  size_t local_510;
  uchar p1_33 [33];
  uchar nonce32 [32];
  secp256k1_scalar local_4b8;
  uchar buf33 [33];
  uchar gen2_33 [33];
  uchar sk32 [32];
  uchar p2_33 [33];
  secp256k1_scalar sp;
  secp256k1_ge r;
  secp256k1_ge rp;
  secp256k1_ge enckey_ge;
  secp256k1_scalar msg;
  secp256k1_gej p1j;
  secp256k1_scalar sigr;
  secp256k1_gej rpj;
  secp256k1_gej rj;
  
  nonce32[0x10] = '\0';
  nonce32[0x11] = '\0';
  nonce32[0x12] = '\0';
  nonce32[0x13] = '\0';
  nonce32[0x14] = '\0';
  nonce32[0x15] = '\0';
  nonce32[0x16] = '\0';
  nonce32[0x17] = '\0';
  nonce32[0x18] = '\0';
  nonce32[0x19] = '\0';
  nonce32[0x1a] = '\0';
  nonce32[0x1b] = '\0';
  nonce32[0x1c] = '\0';
  nonce32[0x1d] = '\0';
  nonce32[0x1e] = '\0';
  nonce32[0x1f] = '\0';
  nonce32[0] = '\0';
  nonce32[1] = '\0';
  nonce32[2] = '\0';
  nonce32[3] = '\0';
  nonce32[4] = '\0';
  nonce32[5] = '\0';
  nonce32[6] = '\0';
  nonce32[7] = '\0';
  nonce32[8] = '\0';
  nonce32[9] = '\0';
  nonce32[10] = '\0';
  nonce32[0xb] = '\0';
  nonce32[0xc] = '\0';
  nonce32[0xd] = '\0';
  nonce32[0xe] = '\0';
  nonce32[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).built == 0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
  }
  else if (adaptor_sig162 == (uchar *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "adaptor_sig162 != NULL";
  }
  else if (seckey32 == (uchar *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "seckey32 != NULL";
  }
  else if (enckey == (secp256k1_pubkey_conflict *)0x0) {
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "enckey != NULL";
  }
  else {
    if (msg32 != (uchar *)0x0) {
      dleq_proof_e.d[2] = 0;
      dleq_proof_e.d[3] = 0;
      dleq_proof_e.d[0] = 0;
      dleq_proof_e.d[1] = 0;
      dleq_proof_s.d[0] = 0;
      dleq_proof_s.d[1] = 0;
      dleq_proof_s.d[2] = 0;
      dleq_proof_s.d[3] = 0;
      pcVar9 = nonce_function_ecdsa_adaptor;
      if (noncefp != (secp256k1_nonce_function_hardened_ecdsa_adaptor)0x0) {
        pcVar9 = noncefp;
      }
      local_580 = adaptor_sig162;
      uVar1 = secp256k1_pubkey_load(ctx,&enckey_ge,enckey);
      uVar2 = secp256k1_eckey_pubkey_serialize(&enckey_ge,buf33,&local_510,1);
      uVar2 = uVar2 & uVar1;
      local_598 = pcVar9;
      local_590 = seckey32;
      local_588 = msg32;
      iVar3 = (*pcVar9)(nonce32,msg32,seckey32,buf33,"ECDSAadaptor/non",0x10,ndata);
      secp256k1_scalar_set_b32(&local_4b8,nonce32,(int *)0x0);
      auVar11._0_4_ = -(uint)((int)local_4b8.d[2] == 0 && (int)local_4b8.d[0] == 0);
      auVar11._4_4_ = -(uint)(local_4b8.d[2]._4_4_ == 0 && local_4b8.d[0]._4_4_ == 0);
      auVar11._8_4_ = -(uint)((int)local_4b8.d[3] == 0 && (int)local_4b8.d[1] == 0);
      auVar11._12_4_ = -(uint)(local_4b8.d[3]._4_4_ == 0 && local_4b8.d[1]._4_4_ == 0);
      iVar4 = movmskps(extraout_EAX,auVar11);
      if (iVar3 == 0) {
        uVar2 = 0;
      }
      if (iVar4 == 0xf) {
        uVar2 = 0;
      }
      secp256k1_scalar_cmov(&local_4b8,&secp256k1_scalar_one,uVar2 ^ 1);
      secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rpj,&local_4b8);
      secp256k1_ge_set_gej(&rp,&rpj);
      secp256k1_ecmult_const(&rj,&enckey_ge,&local_4b8,0x100);
      secp256k1_ge_set_gej(&r,&rj);
      local_528 = (undefined1  [16])0x0;
      local_538 = (undefined1  [16])0x0;
      secp256k1_scalar_get_b32(sk32,&local_4b8);
      iVar3 = secp256k1_eckey_pubkey_serialize(&enckey_ge,gen2_33,&local_5a0,1);
      uVar1 = 0;
      if (iVar3 != 0) {
        iVar3 = secp256k1_eckey_pubkey_serialize(&rp,p1_33,&local_5a0,1);
        uVar1 = 0;
        if (iVar3 != 0) {
          iVar3 = secp256k1_eckey_pubkey_serialize(&r,p2_33,&local_5a0,1);
          uVar1 = 0;
          if (iVar3 != 0) {
            p1j.x.n[0] = 0xbb67ae856a09e667;
            p1j.x.n[1] = 0xa54ff53a3c6ef372;
            p1j.x.n[2] = 0x9b05688c510e527f;
            p1j.x.n[3] = 0x5be0cd191f83d9ab;
            p1j.z.n[2] = 0;
            secp256k1_sha256_write((secp256k1_sha256 *)&p1j,p1_33,0x21);
            secp256k1_sha256_write((secp256k1_sha256 *)&p1j,p2_33,0x21);
            secp256k1_sha256_finalize((secp256k1_sha256 *)&p1j,(uchar *)&msg);
            iVar3 = (*local_598)((uchar *)&sp,(uchar *)&msg,sk32,gen2_33,"DLEQ",4,ndata);
            if (iVar3 == 0) {
              uVar1 = 0;
            }
            else {
              secp256k1_scalar_set_b32((secp256k1_scalar *)local_538,(uchar *)&sp,(int *)0x0);
              auVar12._0_4_ = -(uint)(local_538._0_4_ == 0 && local_528._0_4_ == 0);
              auVar12._4_4_ = -(uint)(local_538._4_4_ == 0 && local_528._4_4_ == 0);
              auVar12._8_4_ = -(uint)(local_538._8_4_ == 0 && local_528._8_4_ == 0);
              auVar12._12_4_ = -(uint)(local_538._12_4_ == 0 && local_528._12_4_ == 0);
              iVar3 = movmskps(extraout_EAX_00,auVar12);
              uVar1 = (uint)(iVar3 != 0xf);
            }
            secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&p1j,(secp256k1_scalar *)local_538);
            secp256k1_ge_set_gej((secp256k1_ge *)&sp,&p1j);
            secp256k1_ecmult_const
                      ((secp256k1_gej *)&msg,&enckey_ge,(secp256k1_scalar *)local_538,0x100);
            secp256k1_ge_set_gej((secp256k1_ge *)&sigr,(secp256k1_gej *)&msg);
            secp256k1_dleq_challenge
                      (&dleq_proof_e,&enckey_ge,(secp256k1_ge *)&sp,(secp256k1_ge *)&sigr,&rp,&r);
            secp256k1_scalar_mul(&dleq_proof_s,&dleq_proof_e,&local_4b8);
            secp256k1_scalar_add(&dleq_proof_s,&dleq_proof_s,(secp256k1_scalar *)local_538);
          }
        }
      }
      uVar5 = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)&p1j,local_590);
      uVar2 = uVar5 & uVar1 & uVar2;
      secp256k1_scalar_cmov((secp256k1_scalar *)&p1j,&secp256k1_scalar_one,uVar2 ^ 1);
      secp256k1_scalar_set_b32(&msg,local_588,(int *)0x0);
      secp256k1_fe_normalize(&r.x);
      secp256k1_fe_get_b32(buf33,&r.x);
      secp256k1_scalar_set_b32(&sigr,buf33,(int *)0x0);
      auVar13._0_4_ = -(uint)((int)sigr.d[2] == 0 && (int)sigr.d[0] == 0);
      auVar13._4_4_ = -(uint)(sigr.d[2]._4_4_ == 0 && sigr.d[0]._4_4_ == 0);
      auVar13._8_4_ = -(uint)((int)sigr.d[3] == 0 && (int)sigr.d[1] == 0);
      auVar13._12_4_ = -(uint)(sigr.d[3]._4_4_ == 0 && sigr.d[1]._4_4_ == 0);
      iVar3 = movmskps(extraout_EAX_01,auVar13);
      secp256k1_scalar_mul((secp256k1_scalar *)gen2_33,&sigr,(secp256k1_scalar *)&p1j);
      secp256k1_scalar_add((secp256k1_scalar *)gen2_33,(secp256k1_scalar *)gen2_33,&msg);
      secp256k1_scalar_inverse(&sp,&local_4b8);
      secp256k1_scalar_mul(&sp,&sp,(secp256k1_scalar *)gen2_33);
      s = local_580;
      auVar10._0_4_ = -(uint)((int)sp.d[2] == 0 && (int)sp.d[0] == 0);
      auVar10._4_4_ = -(uint)(sp.d[2]._4_4_ == 0 && sp.d[0]._4_4_ == 0);
      auVar10._8_4_ = -(uint)((int)sp.d[3] == 0 && (int)sp.d[1] == 0);
      auVar10._12_4_ = -(uint)(sp.d[3]._4_4_ == 0 && sp.d[1]._4_4_ == 0);
      iVar4 = movmskps(extraout_EAX_02,auVar10);
      iVar6 = secp256k1_eckey_pubkey_serialize(&r,local_580,(size_t *)p1_33,1);
      if (iVar6 == 0) {
        uVar1 = 0;
      }
      else {
        iVar6 = secp256k1_eckey_pubkey_serialize(&rp,s + 0x21,(size_t *)p1_33,1);
        uVar1 = 0;
        if (iVar6 != 0) {
          secp256k1_scalar_get_b32(s + 0x42,&sp);
          secp256k1_scalar_get_b32(s + 0x62,&dleq_proof_e);
          secp256k1_scalar_get_b32(s + 0x82,&dleq_proof_s);
          uVar1 = 1;
        }
      }
      uVar2 = uVar1 & uVar2 & ~(uint)(iVar4 == 0xf || iVar3 == 0xf);
      secp256k1_memczero(s,0xa2,uVar2 ^ 1);
      return uVar2;
    }
    pvVar7 = (ctx->illegal_callback).data;
    pcVar8 = "msg32 != NULL";
  }
  (*(ctx->illegal_callback).fn)(pcVar8,pvVar7);
  return 0;
}

Assistant:

int secp256k1_ecdsa_adaptor_encrypt(const secp256k1_context* ctx, unsigned char *adaptor_sig162, unsigned char *seckey32, const secp256k1_pubkey *enckey, const unsigned char *msg32, secp256k1_nonce_function_hardened_ecdsa_adaptor noncefp, void *ndata) {
    secp256k1_scalar k;
    secp256k1_gej rj, rpj;
    secp256k1_ge r, rp;
    secp256k1_ge enckey_ge;
    secp256k1_scalar dleq_proof_s;
    secp256k1_scalar dleq_proof_e;
    secp256k1_scalar sk;
    secp256k1_scalar msg;
    secp256k1_scalar sp;
    secp256k1_scalar sigr;
    secp256k1_scalar n;
    unsigned char nonce32[32] = { 0 };
    unsigned char buf33[33];
    size_t size = 33;
    int ret = 1;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(adaptor_sig162 != NULL);
    ARG_CHECK(seckey32 != NULL);
    ARG_CHECK(enckey != NULL);
    ARG_CHECK(msg32 != NULL);

    secp256k1_scalar_clear(&dleq_proof_e);
    secp256k1_scalar_clear(&dleq_proof_s);

    if (noncefp == NULL) {
        noncefp = secp256k1_nonce_function_ecdsa_adaptor;
    }

    ret &= secp256k1_pubkey_load(ctx, &enckey_ge, enckey);
    ret &= secp256k1_eckey_pubkey_serialize(&enckey_ge, buf33, &size, 1);
    ret &= !!noncefp(nonce32, msg32, seckey32, buf33, ecdsa_adaptor_algo, sizeof(ecdsa_adaptor_algo), ndata);
    secp256k1_scalar_set_b32(&k, nonce32, NULL);
    ret &= !secp256k1_scalar_is_zero(&k);
    secp256k1_scalar_cmov(&k, &secp256k1_scalar_one, !ret);

    /* R' := k*G */
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx, &rpj, &k);
    secp256k1_ge_set_gej(&rp, &rpj);
    /* R = k*Y; */
    secp256k1_ecmult_const(&rj, &enckey_ge, &k, 256);
    secp256k1_ge_set_gej(&r, &rj);
    /* We declassify the non-secret values rp and r to allow using them
     * as branch points. */
    secp256k1_declassify(ctx, &rp, sizeof(rp));
    secp256k1_declassify(ctx, &r, sizeof(r));

    /* dleq_proof = DLEQ_prove(k, (R', Y, R)) */
    ret &= secp256k1_dleq_prove(ctx, &dleq_proof_s, &dleq_proof_e, &k, &enckey_ge, &rp, &r, noncefp, ndata);

    ret &= secp256k1_scalar_set_b32_seckey(&sk, seckey32);
    secp256k1_scalar_cmov(&sk, &secp256k1_scalar_one, !ret);
    secp256k1_scalar_set_b32(&msg, msg32, NULL);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_get_b32(buf33, &r.x);
    secp256k1_scalar_set_b32(&sigr, buf33, NULL);
    ret &= !secp256k1_scalar_is_zero(&sigr);
    /* s' = k⁻¹(m + R.x * x) */
    secp256k1_scalar_mul(&n, &sigr, &sk);
    secp256k1_scalar_add(&n, &n, &msg);
    secp256k1_scalar_inverse(&sp, &k);
    secp256k1_scalar_mul(&sp, &sp, &n);
    ret &= !secp256k1_scalar_is_zero(&sp);

    /* return (R, R', s', dleq_proof) */
    ret &= secp256k1_ecdsa_adaptor_sig_serialize(adaptor_sig162, &r, &rp, &sp, &dleq_proof_e, &dleq_proof_s);

    secp256k1_memczero(adaptor_sig162, 162, !ret);
    secp256k1_scalar_clear(&n);
    secp256k1_scalar_clear(&k);
    secp256k1_scalar_clear(&sk);

    return ret;
}